

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::objectivec::GPBGenericValueFieldName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  objectivec oVar1;
  Nonnull<const_char_*> pcVar2;
  bool v1;
  char *pcVar3;
  char *pcVar4;
  LogMessage local_20;
  
  oVar1 = this[1];
  v1 = (bool)(((byte)oVar1 & 0x20) >> 5);
  if (0xbf < (byte)oVar1 == v1) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (v1,0xbf < (byte)oVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar2 != (Nonnull<const_char_*>)0x0) {
    GPBGenericValueFieldName_abi_cxx11_();
LAB_002c78c7:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_20);
  }
  if (((byte)this[1] & 0x20) == 0) {
    oVar1 = this[2];
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)oVar1 * 4)) {
    case 1:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "valueInt32";
      pcVar3 = "";
      break;
    case 2:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "valueInt64";
      pcVar3 = "";
      break;
    case 3:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "valueUInt32";
      pcVar3 = "";
      break;
    case 4:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "valueUInt64";
      pcVar3 = "";
      break;
    case 5:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "valueDouble";
      pcVar3 = "";
      break;
    case 6:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "valueFloat";
      pcVar3 = "";
      break;
    case 7:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "valueBool";
      pcVar3 = "";
      break;
    case 8:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "valueEnum";
      pcVar3 = "";
      break;
    case 9:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (oVar1 == (objectivec)0xc) {
        pcVar4 = "valueData";
        pcVar3 = "";
      }
      else {
        pcVar4 = "valueString";
        pcVar3 = "";
      }
      break;
    case 10:
      goto switchD_002c7758_caseD_a;
    default:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/helpers.cc"
                 ,0xe8);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&local_20,(char (*) [16])"Can\'t get here.");
      goto LAB_002c78c7;
    }
  }
  else {
switchD_002c7758_caseD_a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "valueMessage";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string GPBGenericValueFieldName(const FieldDescriptor* field) {
  // Returns the field within the GPBGenericValue union to use for the given
  // field.
  if (field->is_repeated()) {
    return "valueMessage";
  }
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return "valueInt32";
    case FieldDescriptor::CPPTYPE_UINT32:
      return "valueUInt32";
    case FieldDescriptor::CPPTYPE_INT64:
      return "valueInt64";
    case FieldDescriptor::CPPTYPE_UINT64:
      return "valueUInt64";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "valueFloat";
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "valueDouble";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "valueBool";
    case FieldDescriptor::CPPTYPE_STRING:
      if (field->type() == FieldDescriptor::TYPE_BYTES) {
        return "valueData";
      } else {
        return "valueString";
      }
    case FieldDescriptor::CPPTYPE_ENUM:
      return "valueEnum";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "valueMessage";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  ABSL_LOG(FATAL) << "Can't get here.";
  return std::string();
}